

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  Result RVar6;
  PolicyStatus PVar7;
  TargetType TVar8;
  string *psVar9;
  cmGeneratorTarget *pcVar10;
  ostream *poVar11;
  cmLinkInterfaceLibraries *libraries;
  cmLinkImplementationLibraries *libraries_00;
  size_t sVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  cmGeneratorExpressionDAGChecker *this_00;
  cmGeneratorTarget *target;
  string linkedTargetsContent;
  string propertyName;
  string interfacePropertyName;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget *local_240;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  char *local_1b8;
  cmGeneratorExpressionDAGChecker *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [56];
  cmListFileBacktrace local_128 [3];
  
  if (1 < ((long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "$<TARGET_PROPERTY:...> expression requires one or two parameters","");
    reportError(context,(string *)local_1a8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar5 != 0)) {
    Evaluate::propertyNameValidator.program = (char *)0x0;
    cmsys::RegularExpression::compile(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  local_240 = context->HeadTarget;
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar3,pcVar3 + pbVar2->_M_string_length);
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  lVar15 = lVar14 >> 5;
  if (lVar15 == 1) {
    context->HadHeadSensitiveCondition = true;
    if (local_240 != (cmGeneratorTarget *)0x0) {
      if (lVar14 == 0x40) goto LAB_0031ca8d;
      goto LAB_0031cb39;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
               ,"");
    reportError(context,(string *)local_1a8,&local_238);
  }
  else if (lVar15 == 2) {
LAB_0031ca8d:
    if (pbVar2->_M_string_length != 0) {
      paVar1 = &local_238.field_2;
      pcVar3 = (pbVar2->_M_dataplus)._M_p;
      local_238._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar3,pcVar3 + pbVar2->_M_string_length);
      std::__cxx11::string::_M_assign((string *)&local_218);
      bVar4 = cmGeneratorExpression::IsValidTargetName(&local_238);
      if (bVar4) {
        iVar5 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar5 == 0) {
          bVar4 = cmMakefile::IsAlias(context->LG->Makefile,&local_238);
          if ((bVar4) &&
             (pcVar10 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_238),
             pcVar10 != (cmGeneratorTarget *)0x0)) {
            psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar10);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar3 = (psVar9->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar9->_M_string_length);
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          }
        }
        else {
          local_240 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_238);
          if (local_240 != (cmGeneratorTarget *)0x0) {
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&context->AllTargets,&local_240);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != paVar1) {
              operator_delete(local_238._M_dataplus._M_p,
                              CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                       local_238.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_0031cb39;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_238._M_dataplus._M_p,
                               local_238._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" not found.",0xc);
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1f8,content);
          std::__cxx11::stringbuf::str();
          reportError(context,&local_1f8,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,
                            CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                     local_1f8.field_2._M_local_buf[0]) + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_160 + 0x28));
        }
      }
      else {
        bVar4 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,local_218._M_dataplus._M_p);
        if (bVar4) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"Target name not supported.","");
          reportError(context,(string *)local_1a8,&local_1f8);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"Target name and property name not supported.","");
          reportError(context,(string *)local_1a8,&local_1f8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                   local_1f8.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0031d9e3;
    }
    if (pbVar2[1]._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name."
                 ,"");
      reportError(context,(string *)local_1a8,&local_238);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.","");
      reportError(context,(string *)local_1a8,&local_238);
    }
  }
  else {
LAB_0031cb39:
    if (local_240 == context->HeadTarget) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&context->SeenTargetProperties,&local_218);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_218);
    if (iVar5 == 0) {
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->SourceSensitiveTargets,&local_240);
    }
    if (local_218._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,
                 "$<TARGET_PROPERTY:...> expression requires a non-empty property name.","");
      reportError(context,(string *)local_1a8,&local_238);
    }
    else {
      bVar4 = cmsys::RegularExpression::find
                        (&Evaluate::propertyNameValidator,local_218._M_dataplus._M_p);
      if (bVar4) {
        if (local_240 == (cmGeneratorTarget *)0x0) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                        ,999,
                        "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                       );
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar5 != 0) {
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(local_240);
          cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                    ((cmGeneratorExpressionDAGChecker *)local_1a8,&context->Backtrace,psVar9,
                     &local_218,content,dagCheckerParent);
          RVar6 = cmGeneratorExpressionDAGChecker::Check
                            ((cmGeneratorExpressionDAGChecker *)local_1a8);
          if (RVar6 == SELF_REFERENCE) {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_238,content);
            cmGeneratorExpressionDAGChecker::ReportError
                      ((cmGeneratorExpressionDAGChecker *)local_1a8,context,&local_238);
LAB_0031d5c4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,
                              CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                       local_238.field_2._M_local_buf[0]) + 1);
            }
LAB_0031d5df:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            if (RVar6 == CYCLIC_REFERENCE) goto LAB_0031d5df;
            local_1b0 = dagCheckerParent;
            if (RVar6 == ALREADY_SEEN) {
              lVar14 = 1;
              do {
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  __return_storage_ptr__->_M_string_length = 0;
                  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                  goto LAB_0031d984;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 8);
            }
            local_1b8 = cmGeneratorTarget::GetProperty(local_240,&local_218);
            this_00 = local_1b0;
            if (local_1b0 != (cmGeneratorExpressionDAGChecker *)0x0) {
              bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                (local_1b0,(char *)0x0);
              if (bVar4) {
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if ((((((iVar5 == 0) ||
                       (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0)) ||
                      (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0)) ||
                     ((iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0 ||
                      (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0)))) ||
                    (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0)) ||
                   ((((iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0 ||
                      (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0)) ||
                     ((iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0 ||
                      (((iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0 ||
                        (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0)) ||
                       (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0))))))
                    || ((iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0 ||
                        (iVar5 = std::__cxx11::string::compare((char *)&local_218), iVar5 == 0))))))
                {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_238,content);
                  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1f8,
                             "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                             ,"");
                  reportError(context,&local_238,&local_1f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                             local_1f8.field_2._M_local_buf[0]) + 1);
                  }
                  goto LAB_0031d5c4;
                }
                if (local_1b8 == (char *)0x0) goto LAB_0031d5df;
              }
              else {
                bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(this_00);
                if ((((!bVar4) &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                        (this_00), !bVar4)) &&
                    ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(this_00)
                     , !bVar4 &&
                     (((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(this_00),
                       !bVar4 && (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                                    (this_00), !bVar4)) &&
                      (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(this_00), !bVar4))
                     )))) && (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                                (this_00), !bVar4)) {
                  __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x434,
                                "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
              }
            }
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            local_238._M_string_length = 0;
            local_238.field_2._M_local_buf[0] = '\0';
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            local_1f8._M_string_length = 0;
            local_1f8.field_2._M_local_buf[0] = '\0';
            iVar5 = std::__cxx11::string::compare((char *)&local_218);
            if (iVar5 == 0) {
              pcVar16 = "INTERFACE_INCLUDE_DIRECTORIES";
LAB_0031d6aa:
              std::__cxx11::string::operator=((string *)&local_1f8,pcVar16);
LAB_0031d6b4:
              pcVar10 = local_240;
              if ((local_1f8._M_string_length != 0) &&
                 (libraries_00 = cmGeneratorTarget::GetLinkImplementationLibraries
                                           (local_240,&context->Config),
                 libraries_00 != (cmLinkImplementationLibraries *)0x0)) {
                getLinkedTargetsContent<cmLinkImplItem>
                          (&local_1d8,&libraries_00->Libraries,local_240,local_240,context,
                           (cmGeneratorExpressionDAGChecker *)local_1a8,&local_1f8);
LAB_0031d6fe:
                std::__cxx11::string::operator=((string *)&local_238,(string *)&local_1d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              pcVar16 = "INTERFACE_INCLUDE_DIRECTORIES";
              iVar5 = std::__cxx11::string::compare((char *)&local_218);
              if (iVar5 != 0) {
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                  goto LAB_0031d6aa;
                }
                pcVar16 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) goto LAB_0031d5f7;
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_COMPILE_DEFINITIONS";
                  goto LAB_0031d6aa;
                }
                pcVar16 = "INTERFACE_COMPILE_DEFINITIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) goto LAB_0031d5f7;
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_COMPILE_OPTIONS";
                  goto LAB_0031d6aa;
                }
                pcVar16 = "INTERFACE_COMPILE_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) goto LAB_0031d5f7;
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_AUTOUIC_OPTIONS";
                  goto LAB_0031d6aa;
                }
                pcVar16 = "INTERFACE_AUTOUIC_OPTIONS";
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) goto LAB_0031d5f7;
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_SOURCES";
                  goto LAB_0031d6aa;
                }
                pcVar16 = "INTERFACE_SOURCES";
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) goto LAB_0031d5f7;
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                if (iVar5 == 0) {
                  pcVar16 = "INTERFACE_COMPILE_FEATURES";
                  this_00 = local_1b0;
                  goto LAB_0031d6aa;
                }
                pcVar16 = "INTERFACE_COMPILE_FEATURES";
                iVar5 = std::__cxx11::string::compare((char *)&local_218);
                this_00 = local_1b0;
                if (iVar5 == 0) goto LAB_0031d5f7;
                iVar5 = strncmp(local_218._M_dataplus._M_p,"COMPILE_DEFINITIONS_",0x14);
                if ((iVar5 == 0) &&
                   (PVar7 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar7 < NEW)) {
                  std::__cxx11::string::operator=
                            ((string *)&local_1f8,"INTERFACE_COMPILE_DEFINITIONS");
                }
                goto LAB_0031d6b4;
              }
LAB_0031d5f7:
              std::__cxx11::string::operator=((string *)&local_1f8,pcVar16);
              pcVar10 = context->HeadTarget;
              if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
                pcVar10 = local_240;
              }
              libraries = cmGeneratorTarget::GetLinkInterfaceLibraries
                                    (local_240,&context->Config,pcVar10,true);
              if (libraries != (cmLinkInterfaceLibraries *)0x0) {
                getLinkedTargetsContent<cmLinkItem>
                          (&local_1d8,&libraries->Libraries,local_240,pcVar10,context,
                           (cmGeneratorExpressionDAGChecker *)local_1a8,&local_1f8);
                goto LAB_0031d6fe;
              }
            }
            if (local_1b8 == (char *)0x0) {
              bVar4 = cmGeneratorTarget::IsImported(local_240);
              if ((bVar4) ||
                 (TVar8 = cmGeneratorTarget::GetType(local_240), TVar8 == INTERFACE_LIBRARY)) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == &local_238.field_2) {
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                local_238.field_2._M_local_buf[0]);
                  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                       local_238.field_2._8_8_;
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = local_238._M_dataplus._M_p;
                  (__return_storage_ptr__->field_2)._M_allocated_capacity =
                       CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                local_238.field_2._M_local_buf[0]);
                }
                __return_storage_ptr__->_M_string_length = local_238._M_string_length;
                local_238._M_string_length = 0;
                local_238.field_2._M_local_buf[0] = '\0';
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              }
              else {
                psVar9 = &context->Config;
                bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                  (local_240,&local_218,psVar9);
                if (bVar4) {
                  context->HadContextSensitiveCondition = true;
                  bVar4 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                    (local_240,&local_218,psVar9);
                  pcVar16 = "0";
                  if (bVar4) {
                    pcVar16 = "1";
                  }
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  pcVar13 = "";
                  if (bVar4) {
                    pcVar13 = "";
                  }
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar13);
                }
                else {
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                    (local_240,&local_218,psVar9);
                  if (bVar4) {
                    context->HadContextSensitiveCondition = true;
                    pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                        (local_240,&local_218,psVar9);
                    pcVar16 = "";
                    if (pcVar13 != (char *)0x0) {
                      pcVar16 = pcVar13;
                    }
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    sVar12 = strlen(pcVar16);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                  }
                  else {
                    bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                      (local_240,&local_218,psVar9);
                    if (bVar4) {
                      context->HadContextSensitiveCondition = true;
                      pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                          (local_240,&local_218,psVar9);
                      pcVar16 = "";
                      if (pcVar13 != (char *)0x0) {
                        pcVar16 = pcVar13;
                      }
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      sVar12 = strlen(pcVar16);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                    }
                    else {
                      bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                        (local_240,&local_218,psVar9);
                      if (bVar4) {
                        context->HadContextSensitiveCondition = true;
                        pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                            (local_240,&local_218,psVar9);
                        pcVar16 = "";
                        if (pcVar13 != (char *)0x0) {
                          pcVar16 = pcVar13;
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        sVar12 = strlen(pcVar16);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_238._M_dataplus._M_p == &local_238.field_2) {
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                        local_238.field_2._M_local_buf[0]);
                          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                               local_238.field_2._8_8_;
                        }
                        else {
                          (__return_storage_ptr__->_M_dataplus)._M_p = local_238._M_dataplus._M_p;
                          (__return_storage_ptr__->field_2)._M_allocated_capacity =
                               CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                        local_238.field_2._M_local_buf[0]);
                        }
                        __return_storage_ptr__->_M_string_length = local_238._M_string_length;
                        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                        local_238._M_string_length = 0;
                        local_238.field_2._M_local_buf[0] = '\0';
                      }
                    }
                  }
                }
              }
            }
            else {
              bVar4 = cmGeneratorTarget::IsImported(local_240);
              if ((this_00 == (cmGeneratorExpressionDAGChecker *)0x0 || bVar4) ||
                 (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                    (this_00,(char *)0x0), bVar4)) {
LAB_0031d766:
                pcVar16 = local_1b8;
                if (local_1f8._M_string_length == 0) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  sVar12 = strlen(local_1b8);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                }
                else {
                  paVar1 = &local_1d8.field_2;
                  local_1d8._M_dataplus._M_p = (pointer)paVar1;
                  sVar12 = strlen(local_1b8);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1d8,pcVar16,pcVar16 + sVar12);
                  cmGeneratorExpressionNode::EvaluateDependentExpression
                            (__return_storage_ptr__,&local_1d8,context->LG,context,pcVar10,local_240
                             ,(cmGeneratorExpressionDAGChecker *)local_1a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  if (local_238._M_string_length != 0) {
                    pcVar16 = ";";
                    if (__return_storage_ptr__->_M_string_length == 0) {
                      pcVar16 = "";
                    }
                    std::operator+(&local_1d8,pcVar16,&local_238);
                    std::__cxx11::string::_M_append
                              ((char *)__return_storage_ptr__,(ulong)local_1d8._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1d8._M_dataplus._M_p,
                                      local_1d8.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              else {
                psVar9 = &context->Config;
                bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                  (local_240,&local_218,psVar9);
                if (bVar4) {
                  context->HadContextSensitiveCondition = true;
                  pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                      (local_240,&local_218,psVar9);
                  pcVar16 = "";
                  if (pcVar13 != (char *)0x0) {
                    pcVar16 = pcVar13;
                  }
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  sVar12 = strlen(pcVar16);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                }
                else {
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                    (local_240,&local_218,psVar9);
                  if (!bVar4) goto LAB_0031d766;
                  context->HadContextSensitiveCondition = true;
                  pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      (local_240,&local_218,psVar9);
                  pcVar16 = "";
                  if (pcVar13 != (char *)0x0) {
                    pcVar16 = pcVar13;
                  }
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  sVar12 = strlen(pcVar16);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar12);
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,
                              CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                       local_1f8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,
                              CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                       local_238.field_2._M_local_buf[0]) + 1);
            }
          }
LAB_0031d984:
          cmListFileBacktrace::~cmListFileBacktrace(local_128);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_p != &local_170) {
            operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1a8._8_8_ != local_198 + 8) {
            operator_delete((void *)local_1a8._8_8_,local_198._8_8_ + 1);
          }
          goto LAB_0031d9e3;
        }
        TVar8 = cmGeneratorTarget::GetType(local_240);
        if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
            (TVar8 != STATIC_LIBRARY)) ||
           ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                               (dagCheckerParent,(char *)0x0), !bVar4 &&
            (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar4)))
           ) {
          cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,local_240,&context->Config);
          goto LAB_0031d9e3;
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,
                   "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                   ,"");
        reportError(context,(string *)local_1a8,&local_238);
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"Property name not supported.","");
        reportError(context,(string *)local_1a8,&local_238);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0031d9e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagCheckerParent
                      ) const
  {
    if (parameters.size() != 1 && parameters.size() != 2)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
      }
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = context->HeadTarget;
    std::string propertyName = *parameters.begin();

    if (parameters.size() == 1)
      {
      context->HadHeadSensitiveCondition = true;
      }
    if (!target && parameters.size() == 1)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
      return std::string();
      }

    if (parameters.size() == 2)
      {
      if (parameters.begin()->empty() && parameters[1].empty())
        {
        reportError(context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
            "target name and property name.");
        return std::string();
        }
      if (parameters.begin()->empty())
        {
        reportError(context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
            "target name.");
        return std::string();
        }

      std::string targetName = parameters.front();
      propertyName = parameters[1];
      if (!cmGeneratorExpression::IsValidTargetName(targetName))
        {
        if (!propertyNameValidator.find(propertyName.c_str()))
          {
          ::reportError(context, content->GetOriginalExpression(),
                        "Target name and property name not supported.");
          return std::string();
          }
        ::reportError(context, content->GetOriginalExpression(),
                      "Target name not supported.");
        return std::string();
        }
      if(propertyName == "ALIASED_TARGET")
        {
        if(context->LG->GetMakefile()->IsAlias(targetName))
          {
          if(cmGeneratorTarget* tgt =
             context->LG->FindGeneratorTargetToUse(targetName))
            {
            return tgt->GetName();
            }
          }
        return "";
        }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target)
        {
        std::ostringstream e;
        e << "Target \""
          << targetName
          << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
        }
      context->AllTargets.insert(target);
      }

    if (target == context->HeadTarget)
      {
      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);
      }
    if (propertyName == "SOURCES")
      {
      context->SourceSensitiveTargets.insert(target);
      }

    if (propertyName.empty())
      {
      reportError(context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:...> expression requires a non-empty property "
          "name.");
      return std::string();
      }

    if (!propertyNameValidator.find(propertyName))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
      }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE")
      {
      if (target->LinkLanguagePropagatesToDependents() &&
          dagCheckerParent && (dagCheckerParent->EvaluatingLinkLibraries()
            || dagCheckerParent->EvaluatingSources()))
        {
        reportError(context, content->GetOriginalExpression(),
            "LINKER_LANGUAGE target property can not be used while evaluating "
            "link libraries for a static library");
        return std::string();
        }
      return target->GetLinkerLanguage(context->Config);
      }

    cmGeneratorExpressionDAGChecker dagChecker(context->Backtrace,
                                               target->GetName(),
                                               propertyName,
                                               content,
                                               dagCheckerParent);

    switch (dagChecker.Check())
      {
    case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
      dagChecker.ReportError(context, content->GetOriginalExpression());
      return std::string();
    case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
      // No error. We just skip cyclic references.
      return std::string();
    case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
      for (size_t i = 1;
          i < cmArraySize(targetPropertyTransitiveWhitelist);
          ++i)
        {
        if (targetPropertyTransitiveWhitelist[i] == propertyName)
          {
          // No error. We're not going to find anything new here.
          return std::string();
          }
        }
    case cmGeneratorExpressionDAGChecker::DAG:
      break;
      }

    const char *prop = target->GetProperty(propertyName);

    if (dagCheckerParent)
      {
      if (dagCheckerParent->EvaluatingLinkLibraries())
        {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY) \
    (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(TRANSITIVE_PROPERTY_COMPARE)
            false)
          {
          reportError(context, content->GetOriginalExpression(),
              "$<TARGET_PROPERTY:...> expression in link libraries "
              "evaluation depends on target property which is transitive "
              "over the link libraries, creating a recursion.");
          return std::string();
          }
#undef TRANSITIVE_PROPERTY_COMPARE

        if(!prop)
          {
          return std::string();
          }
        }
      else
        {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) \
  dagCheckerParent->METHOD () ||

        assert(
          CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
                                            ASSERT_TRANSITIVE_PROPERTY_METHOD)
          false);
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
        }
      }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop) \
    if (propertyName == #prop) \
      { \
      interfacePropertyName = "INTERFACE_" #prop; \
      } \
    else if (propertyName == "INTERFACE_" #prop) \
      { \
      interfacePropertyName = "INTERFACE_" #prop; \
      isInterfaceProperty = true; \
      } \
    else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
      // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName.c_str(),
                           "COMPILE_DEFINITIONS_"))
      {
      cmPolicies::PolicyStatus polSt =
          context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD)
        {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
        }
      }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
        context->HeadTarget && isInterfaceProperty
                               ? context->HeadTarget : target;

    if(isInterfaceProperty)
      {
      if(cmLinkInterfaceLibraries const* iface =
         target->GetLinkInterfaceLibraries(context->Config, headTarget, true))
        {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target,
                                  headTarget,
                                  context, &dagChecker,
                                  interfacePropertyName);
        }
      }
    else if(!interfacePropertyName.empty())
      {
      if(cmLinkImplementationLibraries const* impl =
         target->GetLinkImplementationLibraries(context->Config))
        {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target,
                                  target,
                                  context, &dagChecker,
                                  interfacePropertyName);
        }
      }

    if (!prop)
      {
      if (target->IsImported()
          || target->GetType() == cmState::INTERFACE_LIBRARY)
        {
        return linkedTargetsContent;
        }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                     context->Config))
        {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(
                                                propertyName,
                                                context->Config) ? "1" : "0";
        }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                       context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                              target->GetLinkInterfaceDependentStringProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                          target->GetLinkInterfaceDependentNumberMinProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                          target->GetLinkInterfaceDependentNumberMaxProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }

      return linkedTargetsContent;
      }

    if (!target->IsImported()
        && dagCheckerParent && !dagCheckerParent->EvaluatingLinkLibraries())
      {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                            target->GetLinkInterfaceDependentNumberMinProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                          context->Config))
        {
        context->HadContextSensitiveCondition = true;
        const char *propContent =
                            target->GetLinkInterfaceDependentNumberMaxProperty(
                                                propertyName,
                                                context->Config);
        return propContent ? propContent : "";
        }
      }
    if(!interfacePropertyName.empty())
      {
      std::string result = this->EvaluateDependentExpression(prop,
                                        context->LG, context,
                                        headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty())
        {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
        }
      return result;
      }
    return prop;
  }